

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

TFilterCoefficients * calculateCoefficientsFirstOrderHighPass(int fc,int fs)

{
  int in_EDX;
  int in_ESI;
  TFilterCoefficients *in_RDI;
  float fVar1;
  double dVar2;
  double dVar3;
  TFilterCoefficients *res;
  float g;
  float th;
  
  TFilterCoefficients::TFilterCoefficients(in_RDI);
  fVar1 = ((float)in_ESI * 6.2831855) / (float)in_EDX;
  dVar2 = cos((double)fVar1);
  dVar3 = sin((double)fVar1);
  fVar1 = (float)(dVar2 / (dVar3 + 1.0));
  in_RDI->a0 = (fVar1 + 1.0) / 2.0;
  in_RDI->a1 = -((fVar1 + 1.0) / 2.0);
  in_RDI->a2 = 0.0;
  in_RDI->b1 = -fVar1;
  in_RDI->b2 = 0.0;
  return in_RDI;
}

Assistant:

TFilterCoefficients calculateCoefficientsFirstOrderHighPass(int fc, int fs) {
    TFilterCoefficients res;

    float th = 2.0 * pi * fc / fs;
    float g = cos(th) / (1.0 + sin(th));
    res.a0 = (1.0 + g) / 2.0;
    res.a1 = -((1.0 + g) / 2.0);
    res.a2 = 0.0;
    res.b1 = -g;
    res.b2 = 0.0;

    return res;
}